

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessVertexArraysTests.cpp
# Opt level: O0

string * gl4cts::DirectStateAccess::VertexArrays::Utilities::replace
                   (string *__return_storage_ptr__,string *src,string *key,string *value)

{
  ulong uVar1;
  string *psVar2;
  size_t pos;
  string *value_local;
  string *key_local;
  string *src_local;
  string *dst;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)src);
  while (uVar1 = std::__cxx11::string::find((string *)__return_storage_ptr__,(ulong)key),
        uVar1 != 0xffffffffffffffff) {
    psVar2 = (string *)std::__cxx11::string::length();
    std::__cxx11::string::replace((ulong)__return_storage_ptr__,uVar1,psVar2);
    std::__cxx11::string::length();
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Utilities::replace(const std::string& src, const std::string& key, const std::string& value)
{
	size_t		pos = 0;
	std::string dst = src;

	while (std::string::npos != (pos = dst.find(key, pos)))
	{
		dst.replace(pos, key.length(), value);
		pos += key.length();
	}

	return dst;
}